

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O3

void __thiscall
helics::BaseTimeCoordinator::BaseTimeCoordinator
          (BaseTimeCoordinator *this,
          function<void_(const_helics::ActionMessage_&)> *userSendMessageFunction)

{
  function<void_(const_helics::ActionMessage_&)> *pfVar1;
  _Manager_type p_Var2;
  undefined8 uVar3;
  
  this->_vptr_BaseTimeCoordinator = (_func_int **)&PTR__BaseTimeCoordinator_00552530;
  (this->dependencies).dependencies.
  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dependencies).dependencies.
  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dependencies).dependencies.
  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dependencies).mDelayedDependency.gid = -2010000000;
  *(undefined8 *)&(this->sendMessageFunction).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->sendMessageFunction).super__Function_base._M_functor + 8) = 0;
  (this->sendMessageFunction).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->sendMessageFunction)._M_invoker = userSendMessageFunction->_M_invoker;
  if ((userSendMessageFunction->super__Function_base)._M_manager == (_Manager_type)0x0) {
    this->mSourceId = 0;
    this->sequenceCounter = 0;
    this->noParent = true;
    this->federatesOnly = false;
    this->checkingExec = false;
    this->executionMode = false;
    this->restrictive_time_policy = false;
    this->restrictive_time_policy = false;
    this->nonGranting = false;
    this->delayedTiming = false;
    this->disconnected = false;
  }
  else {
    uVar3 = *(undefined8 *)((long)&(userSendMessageFunction->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->sendMessageFunction).super__Function_base._M_functor =
         *(undefined8 *)&(userSendMessageFunction->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->sendMessageFunction).super__Function_base._M_functor + 8) = uVar3;
    pfVar1 = (function<void_(const_helics::ActionMessage_&)> *)
             (userSendMessageFunction->super__Function_base)._M_manager;
    (this->sendMessageFunction).super__Function_base._M_manager = (_Manager_type)pfVar1;
    (userSendMessageFunction->super__Function_base)._M_manager = (_Manager_type)0x0;
    userSendMessageFunction->_M_invoker = (_Invoker_type)0x0;
    p_Var2 = (this->sendMessageFunction).super__Function_base._M_manager;
    this->mSourceId = 0;
    this->sequenceCounter = 0;
    this->noParent = true;
    this->federatesOnly = false;
    this->checkingExec = false;
    this->executionMode = false;
    this->restrictive_time_policy = false;
    this->restrictive_time_policy = false;
    this->nonGranting = false;
    this->delayedTiming = false;
    this->disconnected = false;
    userSendMessageFunction = pfVar1;
    if (p_Var2 != (_Manager_type)0x0) {
      return;
    }
  }
  std::function<void(helics::ActionMessage_const&)>::operator=
            ((function<void(helics::ActionMessage_const&)> *)&this->sendMessageFunction,
             (anon_class_1_0_00000001 *)userSendMessageFunction);
  return;
}

Assistant:

BaseTimeCoordinator::BaseTimeCoordinator(
    std::function<void(const ActionMessage&)> userSendMessageFunction):
    sendMessageFunction(std::move(userSendMessageFunction))
{
    if (!sendMessageFunction) {
        sendMessageFunction = nullMessageFunction;
    }
}